

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_icu::create_parsing
          (impl_icu *this,locale *in,cdata *cd,character_facet_type type)

{
  if (type == 2) {
    install_parsing_facets<wchar_t>(this,in,cd);
  }
  else if (type == 1) {
    install_parsing_facets<char>(this,in,cd);
  }
  else {
    std::locale::locale((locale *)this,in);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_parsing(std::locale const &in,cdata const &cd,character_facet_type type)
{
        switch(type) {
        case char_facet:
            return install_parsing_facets<char>(in,cd);
        case wchar_t_facet:
            return install_parsing_facets<wchar_t>(in,cd);
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            return install_parsing_facets<char16_t>(in,cd);
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            return install_parsing_facets<char32_t>(in,cd);
        #endif
        default:
            return in;
        }
}